

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O3

int quicly_local_cid_retire(quicly_local_cid_set_t *set,uint64_t sequence,int *_has_pending)

{
  en_quicly_local_cid_state_t eVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint64_t uVar13;
  undefined4 uVar14;
  en_quicly_local_cid_state_t eVar15;
  undefined4 uVar16;
  int iVar17;
  uint64_t *puVar18;
  quicly_local_cid_t *pqVar19;
  ulong uVar20;
  quicly_local_cid_t *pqVar21;
  ulong uVar22;
  ulong idx;
  bool bVar23;
  bool bVar24;
  quicly_local_cid_t tmp;
  
  uVar20 = set->_size;
  if (uVar20 == 0) {
LAB_00126965:
    eVar1 = set->cids[0].state;
  }
  else {
    puVar18 = &set->cids[0].sequence;
    bVar24 = true;
    uVar22 = 0;
    idx = uVar20;
    do {
      if (((quicly_local_cid_t *)(puVar18 + -1))->state != QUICLY_LOCAL_CID_STATE_IDLE) {
        if (*puVar18 == sequence) {
          bVar23 = idx != uVar20;
          idx = uVar22;
          if (bVar23) {
            __assert_fail("retired_at == set->_size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                          ,0xbf,
                          "int quicly_local_cid_retire(quicly_local_cid_set_t *, uint64_t, int *)");
          }
        }
        else {
          bVar24 = false;
        }
      }
      uVar22 = uVar22 + 1;
      puVar18 = puVar18 + 7;
    } while (uVar20 != uVar22);
    if (idx == uVar20) goto LAB_00126965;
    if (bVar24) {
      return 0x2000a;
    }
    set->cids[idx].state = QUICLY_LOCAL_CID_STATE_IDLE;
    set->cids[idx].sequence = 0xffffffffffffffff;
    if (idx + 1 < uVar20) {
      pqVar19 = set->cids + idx + 1;
      uVar20 = idx;
      do {
        idx = uVar20;
        if (pqVar19->state != QUICLY_LOCAL_CID_STATE_PENDING) break;
        uVar2 = *(undefined8 *)((long)(pqVar19 + -1) + 0x30);
        uVar3 = *(undefined8 *)(pqVar19 + -1);
        uVar4 = *(undefined8 *)((long)(pqVar19 + -1) + 8);
        uVar5 = *(undefined8 *)((long)(pqVar19 + -1) + 0x10);
        uVar6 = *(undefined8 *)((long)(pqVar19 + -1) + 0x18);
        uVar7 = *(undefined8 *)((long)(pqVar19 + -1) + 0x20);
        uVar8 = *(undefined8 *)((long)(pqVar19 + -1) + 0x28);
        uVar9 = *(undefined8 *)(pqVar19->cid).cid;
        uVar10 = *(undefined8 *)((pqVar19->cid).cid + 8);
        uVar11 = *(undefined8 *)((pqVar19->cid).cid + 0x10);
        uVar12 = *(undefined8 *)(pqVar19->stateless_reset_token + 3);
        *(undefined8 *)(pqVar19 + -1) = *(undefined8 *)pqVar19;
        *(uint64_t *)((long)(pqVar19 + -1) + 8) = pqVar19->sequence;
        *(undefined8 *)((long)(pqVar19 + -1) + 0x10) = uVar9;
        *(undefined8 *)((long)(pqVar19 + -1) + 0x18) = uVar10;
        *(undefined8 *)((long)(pqVar19 + -1) + 0x20) = uVar11;
        *(undefined8 *)((long)(pqVar19 + -1) + 0x28) = uVar12;
        *(undefined8 *)((long)(pqVar19 + -1) + 0x30) =
             *(undefined8 *)(pqVar19->stateless_reset_token + 0xb);
        *(undefined8 *)pqVar19 = uVar3;
        pqVar19->sequence = uVar4;
        *(undefined8 *)(pqVar19->cid).cid = uVar5;
        *(undefined8 *)((pqVar19->cid).cid + 8) = uVar6;
        *(undefined8 *)((pqVar19->cid).cid + 0x10) = uVar7;
        *(undefined8 *)(pqVar19->stateless_reset_token + 3) = uVar8;
        *(undefined8 *)(pqVar19->stateless_reset_token + 0xb) = uVar2;
        idx = uVar20 + 1;
        pqVar19 = pqVar19 + 1;
        uVar22 = uVar20 + 2;
        uVar20 = idx;
      } while (uVar22 < set->_size);
    }
    pqVar19 = set->cids;
    iVar17 = generate_cid(set,idx);
    if (iVar17 != 0) {
      pqVar19[idx].state = QUICLY_LOCAL_CID_STATE_PENDING;
      bVar24 = true;
      if (idx != 0) {
        pqVar21 = pqVar19 + idx;
        do {
          if (pqVar19->state != QUICLY_LOCAL_CID_STATE_PENDING) {
            uVar2 = *(undefined8 *)(pqVar19->stateless_reset_token + 0xb);
            eVar15 = pqVar19->state;
            uVar16 = *(undefined4 *)&pqVar19->field_0x4;
            uVar4 = pqVar19->sequence;
            uVar3 = *(undefined8 *)(pqVar19->cid).cid;
            uVar5 = *(undefined8 *)((pqVar19->cid).cid + 8);
            uVar6 = *(undefined8 *)((pqVar19->cid).cid + 0x10);
            uVar7 = *(undefined8 *)(pqVar19->stateless_reset_token + 3);
            *(undefined8 *)(pqVar19->stateless_reset_token + 0xb) =
                 *(undefined8 *)(pqVar21->stateless_reset_token + 0xb);
            eVar1 = pqVar21->state;
            uVar14 = *(undefined4 *)&pqVar21->field_0x4;
            uVar13 = pqVar21->sequence;
            uVar8 = *(undefined8 *)(pqVar21->cid).cid;
            uVar9 = *(undefined8 *)((pqVar21->cid).cid + 8);
            uVar10 = *(undefined8 *)(pqVar21->stateless_reset_token + 3);
            *(undefined8 *)((pqVar19->cid).cid + 0x10) = *(undefined8 *)((pqVar21->cid).cid + 0x10);
            *(undefined8 *)(pqVar19->stateless_reset_token + 3) = uVar10;
            *(undefined8 *)(pqVar19->cid).cid = uVar8;
            *(undefined8 *)((pqVar19->cid).cid + 8) = uVar9;
            pqVar19->state = eVar1;
            *(undefined4 *)&pqVar19->field_0x4 = uVar14;
            pqVar19->sequence = uVar13;
            *(undefined8 *)(pqVar21->stateless_reset_token + 0xb) = uVar2;
            *(undefined8 *)((pqVar21->cid).cid + 0x10) = uVar6;
            *(undefined8 *)(pqVar21->stateless_reset_token + 3) = uVar7;
            *(undefined8 *)(pqVar21->cid).cid = uVar3;
            *(undefined8 *)((pqVar21->cid).cid + 8) = uVar5;
            pqVar21->state = eVar15;
            *(undefined4 *)&pqVar21->field_0x4 = uVar16;
            pqVar21->sequence = uVar4;
            break;
          }
          pqVar19 = pqVar19 + 1;
          idx = idx - 1;
        } while (idx != 0);
      }
      goto LAB_0012696c;
    }
    eVar1 = pqVar19->state;
  }
  bVar24 = eVar1 == QUICLY_LOCAL_CID_STATE_PENDING;
LAB_0012696c:
  *_has_pending = (uint)bVar24;
  return 0;
}

Assistant:

int quicly_local_cid_retire(quicly_local_cid_set_t *set, uint64_t sequence, int *_has_pending)
{
    /* find the CID to be retired, also check if there is at least one CID that has been issued */
    size_t retired_at = set->_size;
    int becomes_empty = 1;
    for (size_t i = 0; i < set->_size; i++) {
        if (set->cids[i].state == QUICLY_LOCAL_CID_STATE_IDLE)
            continue;
        if (set->cids[i].sequence == sequence) {
            assert(retired_at == set->_size);
            retired_at = i;
        } else {
            becomes_empty = 0;
        }
    }

    /* nothing to do if given CID has been retired already */
    if (retired_at == set->_size) {
        *_has_pending = has_pending(set);
        return 0;
    }

    /* it is a protocol violation for the remote peer to retire the only CID that is available to it */
    if (becomes_empty)
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;

    /* retire given CID */
    set->cids[retired_at].state = QUICLY_LOCAL_CID_STATE_IDLE;
    set->cids[retired_at].sequence = UINT64_MAX;

    /* move following PENDING CIDs to front */
    for (size_t i = retired_at + 1; i < set->_size; i++) {
        if (set->cids[i].state != QUICLY_LOCAL_CID_STATE_PENDING)
            break;
        swap_cids(&set->cids[i], &set->cids[retired_at]);
        retired_at = i;
    }

    /* generate one new CID */
    if (generate_cid(set, retired_at)) {
        do_mark_pending(set, retired_at);
        *_has_pending = 1;
    } else {
        *_has_pending = has_pending(set);
    }

    return 0;
}